

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedCollator::getReorderCodes
          (RuleBasedCollator *this,int32_t *dest,int32_t capacity,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t length;
  UErrorCode *errorCode_local;
  int32_t capacity_local;
  int32_t *dest_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((capacity < 0) || ((dest == (int32_t *)0x0 && (0 < capacity)))) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = this->settings->reorderCodesLength;
      if (this_local._4_4_ == 0) {
        this_local._4_4_ = 0;
      }
      else if (capacity < this_local._4_4_) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        memcpy(dest,this->settings->reorderCodes,(long)(this_local._4_4_ << 2));
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
RuleBasedCollator::getReorderCodes(int32_t *dest, int32_t capacity,
                                   UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(capacity < 0 || (dest == NULL && capacity > 0)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t length = settings->reorderCodesLength;
    if(length == 0) { return 0; }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return length;
    }
    uprv_memcpy(dest, settings->reorderCodes, length * 4);
    return length;
}